

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O0

TempBufferPoolReservation * __thiscall
duckdb::StandardBufferManager::EvictBlocksOrThrow<char_const*,std::__cxx11::string>
          (StandardBufferManager *this,MemoryTag tag,idx_t memory_delta,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *buffer,
          char *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  long *plVar1;
  __int_type _Var2;
  char *pcVar3;
  undefined8 uVar4;
  idx_t in_RCX;
  undefined1 in_DL;
  long in_RSI;
  TempBufferPoolReservation *in_RDI;
  undefined8 in_R8;
  char *in_R9;
  string *in_stack_00000008;
  string extra_text;
  EvictionResult r;
  StandardBufferManager *in_stack_fffffffffffffe38;
  TempBufferPoolReservation *in_stack_fffffffffffffe40;
  __atomic_base<unsigned_long> *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  OutOfMemoryException *in_stack_fffffffffffffee0;
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [55];
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  byte local_50 [32];
  char *local_30;
  undefined8 local_28;
  idx_t multiplier;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar5;
  
  plVar1 = *(long **)(in_RSI + 0x10);
  local_30 = in_R9;
  local_28 = in_R8;
  multiplier = in_RCX;
  uVar5 = in_DL;
  _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffe48);
  (**(code **)(*plVar1 + 0x18))(local_50,plVar1,in_DL,in_RCX,_Var2,local_28);
  if ((local_50[0] & 1) == 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_90," (%s/%s used)",&local_91);
    GetUsedMemory((StandardBufferManager *)0xc7332c);
    StringUtil::BytesToHumanReadableString_abi_cxx11_
              (CONCAT17(uVar5,in_stack_ffffffffffffffe8),multiplier);
    GetMaxMemory((StandardBufferManager *)0xc73356);
    StringUtil::BytesToHumanReadableString_abi_cxx11_
              (CONCAT17(uVar5,in_stack_ffffffffffffffe8),multiplier);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    ::std::__cxx11::string::~string(local_e8);
    ::std::__cxx11::string::~string(local_c8);
    ::std::__cxx11::string::~string(local_90);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
    pcVar3 = InMemoryWarning(in_stack_fffffffffffffe38);
    ::std::__cxx11::string::operator+=(local_70,pcVar3);
    uVar4 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_108,local_30,&local_109);
    ::std::__cxx11::string::string((string *)&stack0xfffffffffffffed0,in_stack_00000008);
    ::std::__cxx11::string::string((string *)&stack0xfffffffffffffeb0,local_70);
    OutOfMemoryException::OutOfMemoryException<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8);
    __cxa_throw(uVar4,&OutOfMemoryException::typeinfo,OutOfMemoryException::~OutOfMemoryException);
  }
  TempBufferPoolReservation::TempBufferPoolReservation
            (in_stack_fffffffffffffe40,(TempBufferPoolReservation *)in_stack_fffffffffffffe38);
  BufferPool::EvictionResult::~EvictionResult((EvictionResult *)0xc7361a);
  return in_RDI;
}

Assistant:

TempBufferPoolReservation StandardBufferManager::EvictBlocksOrThrow(MemoryTag tag, idx_t memory_delta,
                                                                    unique_ptr<FileBuffer> *buffer, ARGS... args) {
	auto r = buffer_pool.EvictBlocks(tag, memory_delta, buffer_pool.maximum_memory, buffer);
	if (!r.success) {
		string extra_text = StringUtil::Format(" (%s/%s used)", StringUtil::BytesToHumanReadableString(GetUsedMemory()),
		                                       StringUtil::BytesToHumanReadableString(GetMaxMemory()));
		extra_text += InMemoryWarning();
		throw OutOfMemoryException(args..., extra_text);
	}
	return std::move(r.reservation);
}